

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

int __thiscall
ncnn::Split::forward
          (Split *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *param_3)

{
  pointer pMVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  pointer pMVar4;
  int *piVar5;
  void *__ptr;
  long *plVar6;
  undefined8 uVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = 0;
  uVar9 = 0;
  while( true ) {
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar4;
    if ((ulong)(lVar8 / 0x48) <= uVar9) break;
    pMVar1 = (pointer)((long)&pMVar4->data + lVar10);
    if (pMVar1 != pMVar3) {
      piVar5 = pMVar3->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = *(int **)((long)&pMVar4->refcount + lVar10);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          __ptr = *(void **)((long)&pMVar4->data + lVar10);
          plVar6 = *(long **)((long)&pMVar4->allocator + lVar10);
          if (plVar6 == (long *)0x0) {
            free(__ptr);
          }
          else {
            (**(code **)(*plVar6 + 0x18))(plVar6,__ptr,lVar8 % 0x48);
          }
        }
      }
      *(undefined8 *)((long)&pMVar4->cstep + lVar10) = 0;
      *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      *(undefined4 *)((long)&pMVar4->c + lVar10) = 0;
      puVar2 = (undefined8 *)((long)&pMVar4->dims + lVar10);
      *puVar2 = 0;
      puVar2[1] = 0;
      piVar5 = pMVar3->refcount;
      puVar2 = (undefined8 *)((long)&pMVar4->data + lVar10);
      *puVar2 = pMVar3->data;
      puVar2[1] = piVar5;
      *(size_t *)((long)&pMVar4->elemsize + lVar10) = pMVar3->elemsize;
      *(int *)((long)&pMVar4->elempack + lVar10) = pMVar3->elempack;
      *(Allocator **)((long)&pMVar4->allocator + lVar10) = pMVar3->allocator;
      uVar7 = *(undefined8 *)&pMVar3->h;
      puVar2 = (undefined8 *)((long)&pMVar4->dims + lVar10);
      *puVar2 = *(undefined8 *)&pMVar3->dims;
      puVar2[1] = uVar7;
      *(int *)((long)&pMVar4->c + lVar10) = pMVar3->c;
      *(size_t *)((long)&pMVar4->cstep + lVar10) = pMVar3->cstep;
    }
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x48;
  }
  return 0;
}

Assistant:

int Split::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& /*opt*/) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    for (size_t i = 0; i < top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blob;
    }

    return 0;
}